

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node expr_operand_fn(Parser *psr)

{
  int iVar1;
  BcIns ins_00;
  Function *fn;
  Node NVar2;
  int set_idx;
  BcIns ins;
  int fn_idx;
  Parser *psr_local;
  Node node;
  
  lex_next(&psr->lxr);
  iVar1 = parse_fn_args_body(psr);
  set_idx._0_2_ = (uint16_t)iVar1;
  ins_00 = bc_new2(BC_SET_F,'\0',(uint16_t)set_idx);
  fn = psr_fn(psr);
  iVar1 = fn_emit(fn,ins_00);
  NVar2.field_1.jmp.false_list = node._4_4_;
  NVar2.field_1.reloc_idx = iVar1;
  NVar2._0_8_ = 4;
  return NVar2;
}

Assistant:

static Node expr_operand_fn(Parser *psr) {
	// Skip the `fn` token
	lex_next(&psr->lxr);

	// Parse the arguments and function body
	int fn_idx = parse_fn_args_body(psr);

	// Emit an instruction to store the function
	BcIns ins = bc_new2(BC_SET_F, 0, (uint16_t) fn_idx);
	int set_idx = fn_emit(psr_fn(psr), ins);

	// Put into a reloc instruction
	Node node;
	node.type = NODE_RELOC;
	node.reloc_idx = set_idx;
	return node;
}